

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void __thiscall QWidgetRepaintManager::flush(QWidgetRepaintManager *this)

{
  QWidget ***debug;
  long lVar1;
  QWidget *pQVar2;
  undefined8 uVar3;
  Data *pDVar4;
  char cVar5;
  QLoggingCategory *pQVar6;
  QDebug *pQVar7;
  QTLWExtra *pQVar8;
  QPlatformTextureList *pQVar9;
  iterator iVar10;
  iterator iVar11;
  long in_FS_OFFSET;
  QArrayDataPointer<QWidget_*> local_98;
  QArrayDataPointer<QWidget_*> local_78;
  char *local_60;
  QDebug local_58;
  QRegion local_50;
  QList<QWidget_*> local_48;
  
  local_48.d.size = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = QtPrivateLogging::lcWidgetPainting();
  if (((pQVar6->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_60 = pQVar6->name;
    local_78.d._0_4_ = 2;
    local_78.d._4_4_ = 0;
    local_78.ptr._0_4_ = 0;
    local_78._12_8_ = 0;
    local_78.size._4_4_ = 0;
    QMessageLogger::info();
    pQVar7 = QDebug::operator<<(&local_58,"Flushing top level");
    local_50.d = (QRegionData *)pQVar7->stream;
    *(int *)((Stream *)local_50.d + 0x28) = *(int *)((Stream *)local_50.d + 0x28) + 1;
    ::operator<<((Stream *)&local_98,&local_50);
    pQVar7 = QDebug::operator<<((QDebug *)&local_98,"and children");
    local_48.d.d = (Data *)pQVar7->stream;
    *(int *)((long)local_48.d.d + 0x28) = *(int *)((long)local_48.d.d + 0x28) + 1;
    debug = &local_48.d.ptr;
    ::operator<<((QDebug)debug,&local_48);
    QDebug::~QDebug((QDebug *)debug);
    QDebug::~QDebug((QDebug *)&local_48);
    QDebug::~QDebug((QDebug *)&local_98);
    QDebug::~QDebug((QDebug *)&local_50);
    QDebug::~QDebug(&local_58);
  }
  lVar1 = *(long *)(this + 0x60);
  cVar5 = QRegion::isEmpty();
  if (cVar5 == '\0') {
    pQVar2 = *(QWidget **)this;
    pQVar9 = widgetTexturesFor(pQVar2,pQVar2);
    flush(this,pQVar2,(QRegion *)(this + 0x48),pQVar9);
    QRegion::QRegion((QRegion *)&local_78);
    uVar3 = *(undefined8 *)(this + 0x48);
    *(ulong *)(this + 0x48) = CONCAT44(local_78.d._4_4_,local_78.d._0_4_);
    local_78.d._0_4_ = (undefined4)uVar3;
    local_78.d._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
    QRegion::~QRegion((QRegion *)&local_78);
    if (lVar1 == 0) goto LAB_0030f65c;
  }
  else if (lVar1 == 0) {
    pQVar8 = QWidgetPrivate::topData(*(QWidgetPrivate **)(*(long *)this + 8));
    if ((pQVar8->widgetTextures).
        super__Vector_base<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pQVar8->widgetTextures).
        super__Vector_base<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pQVar9 = widgetTexturesFor(*(QWidget **)this,*(QWidget **)this);
      if (pQVar9 != (QPlatformTextureList *)0x0) {
        pQVar2 = *(QWidget **)this;
        QRegion::QRegion((QRegion *)&local_78);
        flush(this,pQVar2,(QRegion *)&local_78,pQVar9);
        QRegion::~QRegion((QRegion *)&local_78);
      }
    }
    goto LAB_0030f65c;
  }
  local_98.d = (Data *)0x0;
  local_98.ptr = (QWidget **)0x0;
  local_98.size = 0;
  std::__exchange<QList<QWidget*>,QList<QWidget*>>
            ((QList<QWidget_*> *)&local_78,(QList<QWidget_*> *)(this + 0x50),
             (QList<QWidget_*> *)&local_98);
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_98);
  iVar10 = QList<QWidget_*>::begin((QList<QWidget_*> *)&local_78);
  iVar11 = QList<QWidget_*>::end((QList<QWidget_*> *)&local_78);
  for (; iVar10.i != iVar11.i; iVar10.i = iVar10.i + 1) {
    pQVar2 = *iVar10.i;
    lVar1 = *(long *)&pQVar2->field_0x8;
    if ((*(byte *)(lVar1 + 0x253) & 2) == 0) {
      pQVar9 = (QPlatformTextureList *)0x0;
    }
    else {
      pQVar9 = widgetTexturesFor(*(QWidget **)this,pQVar2);
    }
    flush(this,pQVar2,*(QRegion **)(lVar1 + 0xa0),pQVar9);
    QRegion::QRegion((QRegion *)&local_98);
    pDVar4 = (Data *)**(undefined8 **)(lVar1 + 0xa0);
    **(undefined8 **)(lVar1 + 0xa0) = local_98.d;
    local_98.d = pDVar4;
    QRegion::~QRegion((QRegion *)&local_98);
  }
  QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_78);
LAB_0030f65c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48.d.size) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetRepaintManager::flush()
{
    qCInfo(lcWidgetPainting) << "Flushing top level"
        << topLevelNeedsFlush << "and children" << needsFlushWidgets;

    const bool hasNeedsFlushWidgets = !needsFlushWidgets.isEmpty();
    bool flushed = false;

    // Flush the top level widget
    if (!topLevelNeedsFlush.isEmpty()) {
        flush(tlw, topLevelNeedsFlush, widgetTexturesFor(tlw, tlw));
        topLevelNeedsFlush = QRegion();
        flushed = true;
    }

    // Render-to-texture widgets are not in topLevelNeedsFlush so flush if we have not done it above.
    if (!flushed && !hasNeedsFlushWidgets) {
        if (!tlw->d_func()->topData()->widgetTextures.empty()) {
            if (QPlatformTextureList *widgetTextures = widgetTexturesFor(tlw, tlw))
                flush(tlw, QRegion(), widgetTextures);
        }
    }

    if (!hasNeedsFlushWidgets)
        return;

    for (QWidget *w : std::exchange(needsFlushWidgets, {})) {
        QWidgetPrivate *wd = w->d_func();
        Q_ASSERT(wd->needsFlush);
        QPlatformTextureList *widgetTexturesForNative = wd->textureChildSeen ? widgetTexturesFor(tlw, w) : nullptr;
        flush(w, *wd->needsFlush, widgetTexturesForNative);
        *wd->needsFlush = QRegion();
    }
}